

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

FString __thiscall Stat_psprites::GetStats(Stat_psprites *this)

{
  uint uVar1;
  uint local_2c;
  DPSprite *pDStack_28;
  int i;
  DPSprite *pspr;
  Stat_psprites *this_local;
  FString *out;
  
  FString::FString((FString *)this);
  for (local_2c = 0; (int)local_2c < 8; local_2c = local_2c + 1) {
    if ((playeringame[(int)local_2c] & 1U) != 0) {
      FString::AppendFormat((FString *)this,"[psprites] player: %d | layers: ",(ulong)local_2c);
      for (pDStack_28 = ::TObjPtr::operator_cast_to_DPSprite_
                                  ((TObjPtr *)((long)(int)local_2c * 0x2a0 + 0xd63540));
          pDStack_28 != (DPSprite *)0x0; pDStack_28 = DPSprite::GetNext(pDStack_28)) {
        uVar1 = DPSprite::GetID(pDStack_28);
        FString::AppendFormat((FString *)this,"%d, ",(ulong)uVar1);
      }
      FString::AppendFormat((FString *)this,"\n");
    }
  }
  return (FString)(char *)this;
}

Assistant:

ADD_STAT(psprites)
{
	FString out;
	DPSprite *pspr;
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		out.AppendFormat("[psprites] player: %d | layers: ", i);

		pspr = players[i].psprites;
		while (pspr)
		{
			out.AppendFormat("%d, ", pspr->GetID());

			pspr = pspr->GetNext();
		}

		out.AppendFormat("\n");
	}

	return out;
}